

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O2

int __thiscall rw::Skin::init(Skin *this,EVP_PKEY_CTX *ctx)

{
  uint8 *puVar1;
  float *pfVar2;
  int in_ECX;
  float *pfVar3;
  int in_EDX;
  
  this->numBones = (int)ctx;
  this->numUsedBones = in_EDX;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/skin.cpp line: 399"
  ;
  puVar1 = (uint8 *)(*DAT_00145dd8)(in_ECX * 0x14 + (int)ctx * 0x40 + in_EDX + 0xf,0x30116);
  this->data = puVar1;
  this->usedBones = (uint8 *)0x0;
  if ((long)this->numUsedBones != 0) {
    this->usedBones = puVar1;
    puVar1 = puVar1 + this->numUsedBones;
  }
  this->inverseMatrices = (float *)0x0;
  pfVar2 = (float *)((ulong)(puVar1 + 0xf) & 0xfffffffffffffff0);
  if ((long)this->numBones != 0) {
    this->inverseMatrices = pfVar2;
    pfVar2 = pfVar2 + (long)this->numBones * 0x10;
  }
  this->indices = (uint8 *)0x0;
  if (in_ECX == 0) {
    pfVar3 = (float *)0x0;
  }
  else {
    this->indices = (uint8 *)pfVar2;
    pfVar3 = (float *)((long)(in_ECX << 2) + (long)pfVar2);
  }
  this->weights = pfVar3;
  this->boneLimit = 0;
  this->numMeshes = 0;
  this->rleSize = 0;
  this->platformData = (void *)0x0;
  this->legacyType = 0;
  this->remapIndices = (int8 *)0x0;
  this->rleCount = (RLEcount *)0x0;
  this->rle = (RLE *)0x0;
  return (int)pfVar2;
}

Assistant:

void
Skin::init(int32 numBones, int32 numUsedBones, int32 numVertices)
{
	this->numBones = numBones;
	this->numUsedBones = numUsedBones;
	uint32 size = this->numUsedBones +
	              this->numBones*64 +
	              numVertices*(16+4) + 0xF;
	this->data = rwNewT(uint8, size, MEMDUR_EVENT | ID_SKIN);
	uint8 *p = this->data;

	this->usedBones = nil;
	if(this->numUsedBones){
		this->usedBones = p;
		p += this->numUsedBones;
	}

	p = (uint8*)(((uintptr)p + 0xF) & ~0xF);
	this->inverseMatrices = nil;
	if(this->numBones){
		this->inverseMatrices = (float*)p;
		p += 64*this->numBones;
	}

	this->indices = nil;
	if(numVertices){
		this->indices = p;
		p += 4*numVertices;
	}

	this->weights = nil;
	if(numVertices)
		this->weights = (float*)p;

	this->boneLimit = 0;
	this->numMeshes = 0;
	this->rleSize = 0;
	this->remapIndices = nil;
	this->rleCount = nil;
	this->rle = nil;

	this->platformData = nil;
	this->legacyType = 0;
}